

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_ld(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_i64 pTVar2;
  TCGTemp *a2;
  uint uVar3;
  uintptr_t o;
  TCGContext_conflict10 *tcg_ctx;
  uintptr_t o_1;
  TCGv_i64 EA;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode;
  if (((uVar1 & 1) != 0) &&
     ((uVar3 = uVar1 >> 0x10 & 0x1f, uVar3 == 0 || (uVar3 == (uVar1 >> 0x15 & 0x1f))))) {
    gen_exception_err(ctx,0x60,0x21);
    return;
  }
  if ((ctx->need_access_type == true) && (ctx->access_type != 0x20)) {
    tcg_gen_op2_ppc64(tcg_ctx_00,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)tcg_ctx_00),0x20
                     );
    ctx->access_type = 0x20;
  }
  a2 = tcg_temp_new_internal_ppc64(tcg_ctx_00,TCG_TYPE_I64,false);
  EA = (TCGv_i64)((long)a2 - (long)tcg_ctx_00);
  gen_addr_imm_index(ctx,EA,3);
  tcg_gen_qemu_ld_i64_ppc64
            (ctx->uc->tcg_ctx,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)),EA,
             (long)ctx->mem_idx,((ctx->opcode & 2) >> 1) * 3 + MO_64 | ctx->default_tcg_memop_mask);
  if (((ctx->opcode & 1) != 0) &&
     (pTVar2 = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0xd & 0xf8)), pTVar2 != EA)) {
    tcg_gen_op2_ppc64(tcg_ctx_00,INDEX_op_mov_i64,(TCGArg)(pTVar2 + (long)tcg_ctx_00),(TCGArg)a2);
  }
  tcg_temp_free_internal_ppc64(tcg_ctx_00,(TCGTemp *)(EA + (long)tcg_ctx_00));
  return;
}

Assistant:

static void gen_ld(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv EA;
    if (Rc(ctx->opcode)) {
        if (unlikely(rA(ctx->opcode) == 0 ||
                     rA(ctx->opcode) == rD(ctx->opcode))) {
            gen_inval_exception(ctx, POWERPC_EXCP_INVAL_INVAL);
            return;
        }
    }
    gen_set_access_type(ctx, ACCESS_INT);
    EA = tcg_temp_new(tcg_ctx);
    gen_addr_imm_index(ctx, EA, 0x03);
    if (ctx->opcode & 0x02) {
        /* lwa (lwau is undefined) */
        gen_qemu_ld32s(ctx, cpu_gpr[rD(ctx->opcode)], EA);
    } else {
        /* ld - ldu */
        gen_qemu_ld64_i64(ctx, cpu_gpr[rD(ctx->opcode)], EA);
    }
    if (Rc(ctx->opcode)) {
        tcg_gen_mov_tl(tcg_ctx, cpu_gpr[rA(ctx->opcode)], EA);
    }
    tcg_temp_free(tcg_ctx, EA);
}